

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O3

void re2::CompileByteMap(int iters,string *regexp)

{
  Regexp *this;
  Prog *this_00;
  LogMessage local_198;
  
  local_198._0_8_ = (regexp->_M_dataplus)._M_p;
  local_198._8_4_ = SUB84(regexp->_M_string_length,0);
  this = Regexp::Parse((StringPiece *)&local_198,LikePerl,(RegexpStatus *)0x0);
  if (this == (Regexp *)0x0) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x2c3,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_198 + 8),"Check failed: re",0x10);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  this_00 = Regexp::CompileToProg(this,0);
  if (this_00 == (Prog *)0x0) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x2c5,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_198 + 8),"Check failed: prog",0x12);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  if (0 < iters) {
    do {
      Prog::ComputeByteMap(this_00);
      iters = iters + -1;
    } while (iters != 0);
  }
  if (this_00 != (Prog *)0x0) {
    Prog::~Prog(this_00);
  }
  operator_delete(this_00);
  Regexp::Decref(this);
  return;
}

Assistant:

void CompileByteMap(int iters, const string& regexp) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(0);
  CHECK(prog);
  for (int i = 0; i < iters; i++) {
    prog->ComputeByteMap();
  }
  delete prog;
  re->Decref();
}